

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O2

i_refvec<double> * __thiscall
TNT::i_refvec<double>::operator=(i_refvec<double> *this,i_refvec<double> *V)

{
  int *piVar1;
  
  if (this != V) {
    piVar1 = this->ref_count_;
    if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
      destroy(this);
    }
    this->data_ = V->data_;
    piVar1 = V->ref_count_;
    this->ref_count_ = piVar1;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
  }
  return this;
}

Assistant:

i_refvec<T> & i_refvec<T>::operator=(const i_refvec<T> &V)
{
	if (this == &V)
		return *this;


	if (ref_count_ != NULL)
	{
		(*ref_count_) --;
		if ((*ref_count_) == 0)
			destroy();
	}

	data_ = V.data_;
	ref_count_ = V.ref_count_;

	if (V.ref_count_ != NULL)
	    (*(V.ref_count_))++;

	return *this;
}